

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O1

QRect __thiscall
QGraphicsItemEffectSourcePrivate::deviceRect(QGraphicsItemEffectSourcePrivate *this)

{
  QWidget *pQVar1;
  QWidgetData *pQVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  
  if ((this->info == (QGraphicsItemPaintInfo *)0x0) ||
     (pQVar1 = this->info->widget, pQVar1 == (QWidget *)0x0)) {
    deviceRect();
    uVar4 = 0xffffffffffffffff;
  }
  else {
    pQVar2 = pQVar1->data;
    uVar4 = CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                     (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  return (QRect)(auVar3 << 0x40);
}

Assistant:

QRect deviceRect() const override
    {
        if (!info || !info->widget) {
            qWarning("QGraphicsEffectSource::deviceRect: Not yet implemented, lacking device context");
            return QRect();
        }
        return info->widget->rect();
    }